

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

void yyDo(GREG *G,yyaction action,int begin,int end,char *name)

{
  yythunk *__ptr;
  int iVar1;
  int iVar2;
  
  iVar2 = G->thunkpos;
  __ptr = G->thunks;
  iVar1 = G->thunkslen;
  while (iVar1 <= iVar2) {
    G->thunkslen = iVar1 * 2;
    __ptr = (yythunk *)realloc(__ptr,(long)(iVar1 * 2) << 5);
    G->thunks = __ptr;
    iVar2 = G->thunkpos;
    iVar1 = G->thunkslen;
  }
  __ptr[iVar2].begin = begin;
  __ptr[iVar2].end = end;
  __ptr[iVar2].action = action;
  __ptr[iVar2].name = name;
  G->thunkpos = iVar2 + 1;
  return;
}

Assistant:

YY_LOCAL(void) yyDo(GREG *G, yyaction action, int begin, int end, const char *name)
{
  while (G->thunkpos >= G->thunkslen)
    {
      G->thunkslen *= 2;
      G->thunks= (yythunk*)YY_REALLOC(G->thunks, sizeof(yythunk) * G->thunkslen, G->data);
    }
  G->thunks[G->thunkpos].begin=  begin;
  G->thunks[G->thunkpos].end=    end;
  G->thunks[G->thunkpos].action= action;
  G->thunks[G->thunkpos].name= name;
  ++G->thunkpos;
}